

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O1

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,FunctionBody *func_body,void *data)

{
  SyntaxTree *pSVar1;
  String *name;
  Guard g_1;
  Guard g;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  Guard local_30;
  
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:588:9)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:588:9)>
             ::_M_manager;
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:588:9)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:588:9)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  local_78._M_unused._M_object = this;
  Guard::Guard(&local_30,(function<void_()> *)&local_78,(function<void_()> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:590:13)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:590:13)>
             ::_M_manager;
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:590:13)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:590:13)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  local_58._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_78,(function<void_()> *)&local_98,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (func_body->has_self_ == true) {
    name = State::GetString(this->state_,"self");
    InsertName(this,name);
  }
  pSVar1 = (func_body->param_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (pSVar1 != (SyntaxTree *)0x0) {
    (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  }
  pSVar1 = (func_body->block_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  Guard::~Guard((Guard *)&local_78);
  Guard::~Guard(&local_30);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(FunctionBody *func_body, void *data)
    {
        SEMANTIC_ANALYSIS_GUARD(EnterFunction, LeaveFunction);
        {
            SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);

            if (func_body->has_self_)
            {
                auto self = state_->GetString("self");
                InsertName(self);
            }

            if (func_body->param_list_)
                func_body->param_list_->Accept(this, nullptr);

            func_body->block_->Accept(this, nullptr);
        }
    }